

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-save.c
# Opt level: O2

void emitf(savestate_t *state,char *fmt,...)

{
  char in_AL;
  size_t sVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  int iVar2;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  if (state->indent_is_due != 0) {
    iVar2 = 0;
    if (0 < state->depth) {
      iVar2 = state->depth;
    }
    while (iVar2 != 0) {
      fwrite("  ",2,1,(FILE *)state->f);
      iVar2 = iVar2 + -1;
    }
  }
  ap[0].reg_save_area = local_e8;
  ap[0].overflow_arg_area = &stack0x00000008;
  ap[0].gp_offset = 0x10;
  ap[0].fp_offset = 0x30;
  vfprintf((FILE *)state->f,fmt,ap);
  sVar1 = strlen(fmt);
  state->indent_is_due = (uint)(fmt[sVar1 - 1] == '\n');
  return;
}

Assistant:

static void emitf(savestate_t *state, const char *fmt, ...)
{
  va_list ap;
  size_t  fmtlen;

  if (state->indent_is_due)
  {
    int depth;
    int i;

    depth = state->depth;
    for (i = 0; i < depth; i++)
    {
#ifdef ZT_DEBUG
      printf("  ");
#endif
      fprintf(state->f, "  ");
    }
  }

#ifdef ZT_DEBUG
  va_start(ap, fmt);
  vprintf(fmt, ap);
  va_end(ap);
#endif

  va_start(ap, fmt);
  vfprintf(state->f, fmt, ap);
  va_end(ap);

  fmtlen = strlen(fmt);
  state->indent_is_due = (fmt[fmtlen - 1] == '\n'); /* weak newline detection */
}